

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O0

void __thiscall llvm::DWARFGdbIndex::dumpTUList(DWARFGdbIndex *this,raw_ostream *OS)

{
  raw_ostream *this_00;
  uint local_134;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>
  local_130;
  const_iterator local_b0;
  TypeUnitEntry *TU;
  const_iterator __end1;
  const_iterator __begin1;
  SmallVector<llvm::DWARFGdbIndex::TypeUnitEntry,_0U> *__range1;
  uint32_t I;
  size_t local_80;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
  local_78;
  raw_ostream *local_18;
  raw_ostream *OS_local;
  DWARFGdbIndex *this_local;
  
  local_18 = OS;
  OS_local = (raw_ostream *)this;
  local_80 = SmallVectorBase::size((SmallVectorBase *)&this->TuList);
  formatv<const_unsigned_int_&,_unsigned_long>
            (&local_78,"\n  Types CU list offset = {0:x}, has {1} entries:\n",&this->TuListOffset,
             &local_80);
  raw_ostream::operator<<(OS,&local_78.super_formatv_object_base);
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
  ::~formatv_object(&local_78);
  __range1._0_4_ = 0;
  __begin1 = (const_iterator)&this->TuList;
  __end1 = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>::begin
                     ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void> *)
                      __begin1);
  TU = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>::end
                 ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void> *)__begin1);
  for (; this_00 = local_18, __end1 != TU; __end1 = __end1 + 1) {
    local_b0 = __end1;
    local_134 = (uint)__range1;
    __range1._0_4_ = (uint)__range1 + 1;
    formatv<unsigned_int,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>
              (&local_130,
               "    {0}: offset = {1:x8}, type_offset = {2:x8}, type_signature = {3:x16}\n",
               &local_134,&__end1->Offset,&__end1->TypeOffset,&__end1->TypeSignature);
    raw_ostream::operator<<(this_00,&local_130.super_formatv_object_base);
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>
    ::~formatv_object(&local_130);
  }
  return;
}

Assistant:

void DWARFGdbIndex::dumpTUList(raw_ostream &OS) const {
  OS << formatv("\n  Types CU list offset = {0:x}, has {1} entries:\n",
                TuListOffset, TuList.size());
  uint32_t I = 0;
  for (const TypeUnitEntry &TU : TuList)
    OS << formatv("    {0}: offset = {1:x8}, type_offset = {2:x8}, "
                  "type_signature = {3:x16}\n",
                  I++, TU.Offset, TU.TypeOffset, TU.TypeSignature);
}